

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall wasm::Wasm2JSBuilder::addBasics(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  size_t sVar1;
  ValueBuilder *pVVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  Ref RVar6;
  Value *pVVar7;
  Ref RVar8;
  Value *pVVar9;
  Ref RVar10;
  Ref RVar11;
  Value *this_00;
  void *pvVar12;
  Ref in_R8;
  IString target;
  IString target_00;
  IString target_01;
  IString target_02;
  IString target_03;
  IString target_04;
  IString target_05;
  IString target_06;
  IString name;
  IString name_00;
  IString name_01;
  IString name_02;
  IString name_03;
  IString name_04;
  IString name_05;
  IString name_06;
  IString key;
  IString name_07;
  IString key_00;
  IString name_08;
  IString key_01;
  IString name_09;
  IString key_02;
  IString name_10;
  IString key_03;
  IString name_11;
  IString key_04;
  IString name_12;
  IString key_05;
  IString name_13;
  IString key_06;
  IString name_14;
  IString key_07;
  IString name_15;
  IString key_08;
  IString name_16;
  
  sVar1 = _getGlobal;
  pVVar2 = INT8ARRAY;
  pVVar9 = cashew::HEAPF64.inst;
  RVar11.inst = cashew::HEAP8.inst;
  if ((wasm->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (wasm->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    RVar8.inst = cashew::HEAP8.inst;
    RVar6 = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,RVar6);
    pcVar5 = cashew::LOAD;
    sVar3 = BUFFER;
    pvVar12 = (void *)0x18;
    pVVar7 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar7->type = Null;
    cashew::Value::free(pVVar7,pvVar12);
    pVVar7->type = String;
    (pVVar7->field_1).str.str._M_len = sVar3;
    (pVVar7->field_1).str.str._M_str = pcVar5;
    target.str._M_str = (char *)pVVar7;
    target.str._M_len = sVar1;
    RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar2,target,RVar8);
    RVar8 = cashew::ValueBuilder::makeNew(RVar8);
    name.str._M_str = (char *)RVar8.inst;
    name.str._M_len = (size_t)pVVar9;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar6.inst,RVar11,name,in_R8);
    sVar4 = _hasLocalName;
    pVVar2 = INT16ARRAY;
    sVar1 = __stringstream;
    RVar11.inst = cashew::HEAP16.inst;
    RVar8.inst = cashew::HEAP16.inst;
    RVar6 = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,RVar6);
    pcVar5 = cashew::LOAD;
    sVar3 = BUFFER;
    pvVar12 = (void *)0x18;
    pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar9->type = Null;
    cashew::Value::free(pVVar9,pvVar12);
    pVVar9->type = String;
    (pVVar9->field_1).str.str._M_len = sVar3;
    (pVVar9->field_1).str.str._M_str = pcVar5;
    target_00.str._M_str = (char *)pVVar9;
    target_00.str._M_len = sVar4;
    RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar2,target_00,RVar8);
    RVar8 = cashew::ValueBuilder::makeNew(RVar8);
    name_00.str._M_str = (char *)RVar8.inst;
    name_00.str._M_len = sVar1;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar6.inst,RVar11,name_00,in_R8);
    sVar3 = _addDefaultOptimizationPasses;
    pVVar2 = INT32ARRAY;
    pVVar9 = cashew::HEAP16.inst;
    RVar11.inst = cashew::HEAP32.inst;
    RVar8.inst = cashew::HEAP32.inst;
    RVar6 = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,RVar6);
    pcVar5 = cashew::LOAD;
    sVar1 = BUFFER;
    pvVar12 = (void *)0x18;
    pVVar7 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar7->type = Null;
    cashew::Value::free(pVVar7,pvVar12);
    pVVar7->type = String;
    (pVVar7->field_1).str.str._M_len = sVar1;
    (pVVar7->field_1).str.str._M_str = pcVar5;
    target_01.str._M_str = (char *)pVVar7;
    target_01.str._M_len = sVar3;
    RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar2,target_01,RVar8);
    RVar8 = cashew::ValueBuilder::makeNew(RVar8);
    name_01.str._M_str = (char *)RVar8.inst;
    name_01.str._M_len = (size_t)pVVar9;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar6.inst,RVar11,name_01,in_R8);
    sVar3 = _getNumLocals;
    RVar11.inst = cashew::HEAPU8.inst;
    sVar1 = _VTT;
    pVVar2 = UINT8ARRAY;
    RVar8.inst = cashew::HEAPU8.inst;
    RVar6 = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,RVar6);
    pcVar5 = cashew::LOAD;
    sVar4 = BUFFER;
    pvVar12 = (void *)0x18;
    pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar9->type = Null;
    cashew::Value::free(pVVar9,pvVar12);
    pVVar9->type = String;
    (pVVar9->field_1).str.str._M_len = sVar4;
    (pVVar9->field_1).str.str._M_str = pcVar5;
    target_02.str._M_str = (char *)pVVar9;
    target_02.str._M_len = sVar1;
    RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar2,target_02,RVar8);
    RVar8 = cashew::ValueBuilder::makeNew(RVar8);
    name_02.str._M_str = (char *)RVar8.inst;
    name_02.str._M_len = sVar3;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar6.inst,RVar11,name_02,in_R8);
    sVar3 = __M_append;
    RVar11.inst = cashew::HEAPU16.inst;
    sVar1 = _stringstream;
    pVVar2 = UINT16ARRAY;
    RVar8.inst = cashew::HEAPU16.inst;
    RVar6 = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,RVar6);
    pcVar5 = cashew::LOAD;
    sVar4 = BUFFER;
    pvVar12 = (void *)0x18;
    pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar9->type = Null;
    cashew::Value::free(pVVar9,pvVar12);
    pVVar9->type = String;
    (pVVar9->field_1).str.str._M_len = sVar4;
    (pVVar9->field_1).str.str._M_str = pcVar5;
    target_03.str._M_str = (char *)pVVar9;
    target_03.str._M_len = sVar1;
    RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar2,target_03,RVar8);
    RVar8 = cashew::ValueBuilder::makeNew(RVar8);
    name_03.str._M_str = (char *)RVar8.inst;
    name_03.str._M_len = sVar3;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar6.inst,RVar11,name_03,in_R8);
    sVar4 = ASM_FUNC;
    RVar11.inst = cashew::HEAPU32.inst;
    sVar1 = cashew::LSHIFT;
    pVVar2 = UINT32ARRAY;
    RVar8.inst = cashew::HEAPU32.inst;
    RVar6 = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,RVar6);
    pcVar5 = cashew::LOAD;
    sVar3 = BUFFER;
    pvVar12 = (void *)0x18;
    pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar9->type = Null;
    cashew::Value::free(pVVar9,pvVar12);
    pVVar9->type = String;
    (pVVar9->field_1).str.str._M_len = sVar3;
    (pVVar9->field_1).str.str._M_str = pcVar5;
    target_04.str._M_str = (char *)pVVar9;
    target_04.str._M_len = sVar1;
    RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar2,target_04,RVar8);
    RVar8 = cashew::ValueBuilder::makeNew(RVar8);
    name_04.str._M_str = (char *)RVar8.inst;
    name_04.str._M_len = sVar4;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar6.inst,RVar11,name_04,in_R8);
    pVVar9 = MIN.inst;
    RVar11.inst = cashew::HEAPF32.inst;
    sVar1 = _memcpy;
    pVVar2 = FLOAT32ARRAY;
    RVar8.inst = cashew::HEAPF32.inst;
    RVar6 = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,RVar6);
    pcVar5 = cashew::LOAD;
    sVar3 = BUFFER;
    pvVar12 = (void *)0x18;
    pVVar7 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar7->type = Null;
    cashew::Value::free(pVVar7,pvVar12);
    pVVar7->type = String;
    (pVVar7->field_1).str.str._M_len = sVar3;
    (pVVar7->field_1).str.str._M_str = pcVar5;
    target_05.str._M_str = (char *)pVVar7;
    target_05.str._M_len = sVar1;
    RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar2,target_05,RVar8);
    RVar8 = cashew::ValueBuilder::makeNew(RVar8);
    name_05.str._M_str = (char *)RVar8.inst;
    name_05.str._M_len = (size_t)pVVar9;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar6.inst,RVar11,name_05,in_R8);
    sVar3 = _VTT;
    RVar11.inst = cashew::HEAPF64.inst;
    sVar1 = _put;
    pVVar2 = FLOAT64ARRAY;
    RVar8.inst = cashew::HEAPF64.inst;
    RVar6 = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,RVar6);
    pcVar5 = cashew::LOAD;
    sVar4 = BUFFER;
    pvVar12 = (void *)0x18;
    pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar9->type = Null;
    cashew::Value::free(pVVar9,pvVar12);
    pVVar9->type = String;
    (pVVar9->field_1).str.str._M_len = sVar4;
    (pVVar9->field_1).str.str._M_str = pcVar5;
    target_06.str._M_str = (char *)pVVar9;
    target_06.str._M_len = sVar1;
    RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar2,target_06,RVar8);
    RVar8 = cashew::ValueBuilder::makeNew(RVar8);
    name_06.str._M_str = (char *)RVar8.inst;
    name_06.str._M_len = sVar3;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar6.inst,RVar11,name_06,in_R8);
  }
  sVar4 = cashew::CONDITIONAL;
  RVar8.inst = MATH_IMUL.inst;
  sVar1 = _strchr;
  RVar11.inst = IMUL.inst;
  RVar6.inst = MATH_IMUL.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar3 = MATH;
  pvVar12 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar12);
  pVVar9->type = String;
  (pVVar9->field_1).str.str._M_len = sVar3;
  (pVVar9->field_1).str.str._M_str = pcVar5;
  key.str._M_str = (char *)RVar6.inst;
  key.str._M_len = sVar1;
  RVar11 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,RVar11,key);
  name_07.str._M_str = (char *)RVar11.inst;
  name_07.str._M_len = sVar4;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar8,name_07,in_R8);
  sVar4 = _getLocalType;
  RVar8.inst = FROUND.inst;
  sVar1 = _interned;
  RVar11.inst = cashew::MATH_FROUND.inst;
  RVar6.inst = cashew::MATH_FROUND.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar3 = MATH;
  pvVar12 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar12);
  pVVar9->type = String;
  (pVVar9->field_1).str.str._M_len = sVar3;
  (pVVar9->field_1).str.str._M_str = pcVar5;
  key_00.str._M_str = (char *)RVar6.inst;
  key_00.str._M_len = sVar4;
  RVar8 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,RVar8,key_00);
  name_08.str._M_str = (char *)RVar8.inst;
  name_08.str._M_len = sVar1;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar11,name_08,in_R8);
  sVar3 = cashew::LE;
  RVar8.inst = ABS.inst;
  sVar1 = cashew::DEFUN;
  RVar11.inst = MATH_ABS.inst;
  RVar6.inst = MATH_ABS.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar4 = MATH;
  pvVar12 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar12);
  pVVar9->type = String;
  (pVVar9->field_1).str.str._M_len = sVar4;
  (pVVar9->field_1).str.str._M_str = pcVar5;
  key_01.str._M_str = (char *)RVar6.inst;
  key_01.str._M_len = sVar3;
  RVar8 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,RVar8,key_01);
  name_09.str._M_str = (char *)RVar8.inst;
  name_09.str._M_len = sVar1;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar11,name_09,in_R8);
  sVar3 = ___throw_bad_alloc;
  RVar8.inst = CLZ32.inst;
  sVar1 = ABI::wasm2js::TABLE_COPY;
  RVar11.inst = MATH_CLZ32.inst;
  RVar6.inst = MATH_CLZ32.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar4 = MATH;
  pvVar12 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar12);
  pVVar9->type = String;
  (pVVar9->field_1).str.str._M_len = sVar4;
  (pVVar9->field_1).str.str._M_str = pcVar5;
  key_02.str._M_str = (char *)RVar6.inst;
  key_02.str._M_len = sVar3;
  RVar8 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,RVar8,key_02);
  name_10.str._M_str = (char *)RVar8.inst;
  name_10.str._M_len = sVar1;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar11,name_10,in_R8);
  sVar4 = _terminate;
  RVar8.inst = MIN.inst;
  sVar1 = cashew::COMPARE_EXCHANGE;
  RVar11.inst = MATH_MIN.inst;
  RVar6.inst = MATH_MIN.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar3 = MATH;
  pvVar12 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar12);
  pVVar9->type = String;
  (pVVar9->field_1).str.str._M_len = sVar3;
  (pVVar9->field_1).str.str._M_str = pcVar5;
  key_03.str._M_str = (char *)RVar6.inst;
  key_03.str._M_len = sVar4;
  RVar8 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,RVar8,key_03);
  name_11.str._M_str = (char *)RVar8.inst;
  name_11.str._M_len = sVar1;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar11,name_11,in_R8);
  sVar3 = ABI::wasm2js::SCRATCH_LOAD_I32;
  RVar8.inst = MAX.inst;
  sVar1 = _Options;
  RVar11.inst = MATH_MAX.inst;
  RVar6.inst = MATH_MAX.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar4 = MATH;
  pvVar12 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar12);
  pVVar9->type = String;
  (pVVar9->field_1).str.str._M_len = sVar4;
  (pVVar9->field_1).str.str._M_str = pcVar5;
  key_04.str._M_str = (char *)RVar6.inst;
  key_04.str._M_len = sVar3;
  RVar8 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,RVar8,key_04);
  name_12.str._M_str = (char *)RVar8.inst;
  name_12.str._M_len = sVar1;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar11,name_12,in_R8);
  sVar4 = __M_need_rehash;
  RVar8.inst = MATH_FLOOR.inst;
  sVar3 = ABI::wasm2js::MEMORY_COPY;
  RVar11.inst = FLOOR.inst;
  RVar6.inst = MATH_FLOOR.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar1 = MATH;
  pvVar12 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar12);
  pVVar9->type = String;
  (pVVar9->field_1).str.str._M_len = sVar1;
  (pVVar9->field_1).str.str._M_str = pcVar5;
  key_05.str._M_str = (char *)RVar6.inst;
  key_05.str._M_len = sVar3;
  RVar11 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,RVar11,key_05);
  name_13.str._M_str = (char *)RVar11.inst;
  name_13.str._M_len = sVar4;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar8,name_13,in_R8);
  pVVar2 = INT16ARRAY;
  RVar8.inst = MATH_CEIL.inst;
  sVar3 = ___cxa_rethrow;
  RVar11.inst = CEIL.inst;
  RVar6.inst = MATH_CEIL.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar1 = MATH;
  pvVar12 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar12);
  pVVar9->type = String;
  (pVVar9->field_1).str.str._M_len = sVar1;
  (pVVar9->field_1).str.str._M_str = pcVar5;
  key_06.str._M_str = (char *)RVar6.inst;
  key_06.str._M_len = sVar3;
  RVar11 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,RVar11,key_06);
  name_14.str._M_str = (char *)RVar11.inst;
  name_14.str._M_len = (size_t)pVVar2;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar8,name_14,in_R8);
  pVVar7 = FLOOR.inst;
  RVar8.inst = MATH_TRUNC.inst;
  pVVar9 = MATH_MAX.inst;
  RVar11.inst = TRUNC.inst;
  RVar6.inst = MATH_TRUNC.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar1 = MATH;
  pvVar12 = (void *)0x18;
  this_00 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  this_00->type = Null;
  cashew::Value::free(this_00,pvVar12);
  this_00->type = String;
  (this_00->field_1).str.str._M_len = sVar1;
  (this_00->field_1).str.str._M_str = pcVar5;
  key_07.str._M_str = (char *)RVar6.inst;
  key_07.str._M_len = (size_t)pVVar9;
  RVar11 = cashew::ValueBuilder::makeDot((ValueBuilder *)this_00,RVar11,key_07);
  name_15.str._M_str = (char *)RVar11.inst;
  name_15.str._M_len = (size_t)pVVar7;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar8,name_15,in_R8);
  sVar4 = _isInteger;
  RVar8.inst = MATH_SQRT.inst;
  sVar1 = cashew::MOD;
  RVar11.inst = SQRT.inst;
  RVar6.inst = MATH_SQRT.inst;
  RVar10 = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,RVar10);
  pcVar5 = _getLocalNameOrGeneric;
  sVar3 = MATH;
  pvVar12 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar12);
  pVVar9->type = String;
  (pVVar9->field_1).str.str._M_len = sVar3;
  (pVVar9->field_1).str.str._M_str = pcVar5;
  key_08.str._M_str = (char *)RVar6.inst;
  key_08.str._M_len = sVar1;
  RVar11 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,RVar11,key_08);
  name_16.str._M_str = (char *)RVar11.inst;
  name_16.str._M_len = sVar4;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar10.inst,RVar8,name_16,in_R8);
  return;
}

Assistant:

void Wasm2JSBuilder::addBasics(Ref ast, Module* wasm) {
  if (!wasm->memories.empty()) {
    // heaps, var HEAP8 = new global.Int8Array(buffer); etc
    auto addHeap = [&](IString name, IString view) {
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);
      ValueBuilder::appendToVar(theVar,
                                name,
                                ValueBuilder::makeNew(ValueBuilder::makeCall(
                                  view, ValueBuilder::makeName(BUFFER))));
    };
    addHeap(HEAP8, INT8ARRAY);
    addHeap(HEAP16, INT16ARRAY);
    addHeap(HEAP32, INT32ARRAY);
    addHeap(HEAPU8, UINT8ARRAY);
    addHeap(HEAPU16, UINT16ARRAY);
    addHeap(HEAPU32, UINT32ARRAY);
    addHeap(HEAPF32, FLOAT32ARRAY);
    addHeap(HEAPF64, FLOAT64ARRAY);
  }
  // core asm.js imports
  auto addMath = [&](IString name, IString base) {
    Ref theVar = ValueBuilder::makeVar();
    ast->push_back(theVar);
    ValueBuilder::appendToVar(
      theVar, name, ValueBuilder::makeDot(ValueBuilder::makeName(MATH), base));
  };
  addMath(MATH_IMUL, IMUL);
  addMath(MATH_FROUND, FROUND);
  addMath(MATH_ABS, ABS);
  addMath(MATH_CLZ32, CLZ32);
  addMath(MATH_MIN, MIN);
  addMath(MATH_MAX, MAX);
  addMath(MATH_FLOOR, FLOOR);
  addMath(MATH_CEIL, CEIL);
  addMath(MATH_TRUNC, TRUNC);
  addMath(MATH_SQRT, SQRT);
}